

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_kry.c
# Opt level: O3

int main(void)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  N_Vector u;
  UserData paVar5;
  sunrealtype **ppsVar6;
  sunindextype *psVar7;
  void *cvode_mem;
  long lVar8;
  char *pcVar9;
  UserData paVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  SUNContext sunctx;
  sunrealtype t;
  undefined8 local_58;
  UserData local_50;
  double local_48;
  void *local_40;
  sunrealtype local_38;
  
  uVar4 = SUNContext_Create(0,&local_58);
  if ((int)uVar4 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(200,local_58);
    if (u == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    paVar5 = (UserData)malloc(0x998);
    lVar13 = 0;
    paVar10 = paVar5;
    do {
      lVar12 = 0;
      do {
        ppsVar6 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
        paVar10->P[0][lVar12] = ppsVar6;
        ppsVar6 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
        paVar10->Jbd[0][lVar12] = ppsVar6;
        psVar7 = (sunindextype *)SUNDlsMat_newIndexArray(2);
        paVar10->pivot[0][lVar12] = psVar7;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 10);
      lVar13 = lVar13 + 1;
      paVar10 = (UserData)(paVar10->P + 1);
    } while (lVar13 != 10);
    paVar5->om = 7.272205216643056e-05;
    paVar5->dx = 2.2222222222222223;
    paVar5->dy = 2.2222222222222223;
    paVar5->hdco = 8.099999999999999e-07;
    paVar5->haco = 0.000225;
    paVar5->vdco = 2.025e-09;
    lVar13 = N_VGetArrayPointer(u);
    auVar3 = _DAT_001040d0;
    auVar2 = _DAT_00104050;
    lVar12 = 0;
    dVar19 = (double)DAT_00104050;
    dVar20 = DAT_00104050._8_8_;
    do {
      dVar14 = ((double)(int)lVar12 * 2.2222222222222223 + 30.0 + -40.0) * 0.1;
      dVar14 = dVar14 * dVar14;
      dVar14 = dVar14 * dVar14 * 0.5 + (1.0 - dVar14);
      lVar8 = -0xa0;
      uVar15 = 0x100000000;
      do {
        iVar11 = (int)(uVar15 >> 0x20);
        auVar17._0_8_ = uVar15 & 0xffffffff;
        auVar17._8_4_ = iVar11;
        auVar17._12_4_ = 0;
        dVar16 = ((SUB168(auVar17 | auVar2,0) - dVar19) * 2.2222222222222223 + 0.0 + -10.0) * 0.1;
        dVar18 = ((SUB168(auVar17 | auVar2,8) - dVar20) * 2.2222222222222223 + 0.0 + -10.0) * 0.1;
        dVar16 = dVar16 * dVar16;
        dVar18 = dVar18 * dVar18;
        dVar16 = dVar16 * dVar16 * 0.5 + (1.0 - dVar16);
        dVar18 = dVar18 * dVar18 * 0.5 + (1.0 - dVar18);
        pdVar1 = (double *)(lVar13 + 0xb0 + lVar8);
        *pdVar1 = dVar18 * 1000000.0 * dVar14;
        pdVar1[1] = dVar18 * 1000000000000.0 * dVar14;
        pdVar1 = (double *)(lVar13 + 0xa0 + lVar8);
        *pdVar1 = dVar16 * 1000000.0 * dVar14;
        pdVar1[1] = dVar16 * 1000000000000.0 * dVar14;
        uVar15 = CONCAT44(iVar11 + auVar3._4_4_,(int)uVar15 + auVar3._0_4_);
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xa0;
    } while (lVar12 != 10);
    cvode_mem = (void *)CVodeCreate(2,local_58);
    local_40 = cvode_mem;
    if (cvode_mem == (void *)0x0) {
      main_cold_2();
      return 1;
    }
    uVar4 = CVodeSetUserData(cvode_mem,paVar5);
    if ((int)uVar4 < 0) {
      pcVar9 = "CVodeSetUserData";
    }
    else {
      uVar4 = CVodeInit(0,cvode_mem,f,u);
      if ((int)uVar4 < 0) {
        pcVar9 = "CVodeInit";
      }
      else {
        uVar4 = CVodeSStolerances(0x3ee4f8b588e368f1,0x3f50624dd2f1a9fc,cvode_mem);
        if ((int)uVar4 < 0) {
          pcVar9 = "CVodeSStolerances";
        }
        else {
          lVar13 = SUNLinSol_SPGMR(u,1,0,local_58);
          if (lVar13 == 0) {
            main_cold_1();
            return 1;
          }
          uVar4 = CVodeSetLinearSolver(cvode_mem,lVar13,0);
          if ((int)uVar4 < 0) {
            pcVar9 = "CVodeSetLinearSolver";
          }
          else {
            uVar4 = CVodeSetJacTimes(cvode_mem,0,jtv);
            if ((int)uVar4 < 0) {
              pcVar9 = "CVodeSetJacTimes";
            }
            else {
              uVar4 = CVodeSetPreconditioner(cvode_mem,Precond,PSolve);
              if (-1 < (int)uVar4) {
                local_50 = paVar5;
                puts(" \n2-species diurnal advection-diffusion problem\n");
                dVar19 = 7200.0;
                iVar11 = 0xc;
                do {
                  local_48 = dVar19;
                  uVar4 = CVode(cvode_mem,u,&local_38,1);
                  PrintOutput(cvode_mem,u,local_38);
                  if ((int)uVar4 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVode",
                            (ulong)uVar4);
                    break;
                  }
                  dVar19 = local_48 + 7200.0;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
                PrintFinalStats(cvode_mem);
                N_VDestroy(u);
                FreeUserData(local_50);
                CVodeFree(&local_40);
                SUNLinSolFree(lVar13);
                SUNContext_Free(&local_58);
                return 0;
              }
              pcVar9 = "CVodeSetPreconditioner";
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SUNLinSol_SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* set the JAcobian-times-vector function */
  retval = CVodeSetJacTimes(cvode_mem, NULL, jtv);
  if (check_retval(&retval, "CVodeSetJacTimes", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* In loop over output points, call CVode, print results, test for error */
  printf(" \n2-species diurnal advection-diffusion problem\n\n");
  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    PrintOutput(cvode_mem, u, t);
    if (check_retval(&retval, "CVode", 1)) { break; }
  }

  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}